

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_delta_box_node(REF_GRID ref_grid)

{
  REF_NODE ref_node_00;
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_170;
  double local_160;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_DBL hx;
  REF_DBL s;
  REF_DBL ht;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL dot;
  REF_DBL n [3];
  REF_DBL factor;
  REF_DBL h;
  REF_DBL radius;
  REF_DBL m_target [6];
  REF_DBL m_int [6];
  REF_DBL m [6];
  REF_INT node;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  m[5]._4_4_ = 0;
  do {
    if (ref_node_00->max <= m[5]._4_4_) {
      return 0;
    }
    if (((-1 < m[5]._4_4_) && (m[5]._4_4_ < ref_node_00->max)) &&
       (-1 < ref_node_00->global[m[5]._4_4_])) {
      uVar1 = ref_node_metric_get(ref_node_00,m[5]._4_4_,m_int + 5);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x19f,"ref_metric_delta_box_node",(ulong)uVar1,"get");
        return uVar1;
      }
      dVar2 = ref_node_00->real[(long)(m[5]._4_4_ * 0xf) + 2] * 0.0 +
              ref_node_00->real[m[5]._4_4_ * 0xf] * 0.90631 +
              ref_node_00->real[(long)(m[5]._4_4_ * 0xf) + 1] * 0.42262;
      dVar3 = pow(-dVar2 * 0.90631 + ref_node_00->real[m[5]._4_4_ * 0xf],2.0);
      dVar4 = pow(-dVar2 * 0.42262 + ref_node_00->real[m[5]._4_4_ * 0xf + 1],2.0);
      dVar2 = pow(-dVar2 * 0.0 + ref_node_00->real[m[5]._4_4_ * 0xf + 2],2.0);
      dVar2 = sqrt(dVar3 + dVar4 + dVar2);
      if (0.007 <= (dVar2 * 0.002) / 0.06339299999999999 + 0.0003) {
        local_130 = 0.007;
      }
      else {
        local_130 = (dVar2 * 0.002) / 0.06339299999999999 + 0.0003;
      }
      local_130 = local_130 * 1.0;
      dVar2 = local_130 * local_130;
      dVar3 = local_130 * local_130;
      local_130 = local_130 * local_130;
      if (1.1 < ref_node_00->real[m[5]._4_4_ * 0xf]) {
        local_148 = (ref_node_00->real[m[5]._4_4_ * 0xf] - 1.1) / 3.9;
        local_138 = local_148;
        if (local_148 < 0.0) {
          local_138 = 0.0;
        }
        if (local_138 <= 1.0) {
          if (local_148 < 0.0) {
            local_148 = 0.0;
          }
          local_140 = local_148;
        }
        else {
          local_140 = 1.0;
        }
        dVar2 = ((1.0 - local_140) * 0.007 + local_140 * 0.07) * 1.0;
        dVar2 = dVar2 * dVar2;
        dVar3 = 4.9000000000000005e-05;
        local_130 = 4.9000000000000005e-05;
      }
      if (((0.1 < ref_node_00->real[m[5]._4_4_ * 0xf + 2]) ||
          (ref_node_00->real[m[5]._4_4_ * 0xf + 2] <= -0.1 &&
           ref_node_00->real[m[5]._4_4_ * 0xf + 2] != -0.1)) ||
         ((1.0 < ref_node_00->real[m[5]._4_4_ * 0xf + 1] ||
          (ref_node_00->real[m[5]._4_4_ * 0xf] <= -0.1 &&
           ref_node_00->real[m[5]._4_4_ * 0xf] != -0.1)))) {
        if (ref_node_00->real[m[5]._4_4_ * 0xf + 2] <= 0.0) {
          local_150 = -ref_node_00->real[m[5]._4_4_ * 0xf + 2];
        }
        else {
          local_150 = ref_node_00->real[m[5]._4_4_ * 0xf + 2];
        }
        if (ref_node_00->real[m[5]._4_4_ * 0xf + 1] <= 0.0) {
          local_160 = -ref_node_00->real[m[5]._4_4_ * 0xf + 1];
        }
        else {
          local_160 = ref_node_00->real[m[5]._4_4_ * 0xf + 1];
        }
        if (ref_node_00->real[m[5]._4_4_ * 0xf] <= 0.0) {
          local_170 = -ref_node_00->real[m[5]._4_4_ * 0xf];
        }
        else {
          local_170 = ref_node_00->real[m[5]._4_4_ * 0xf];
        }
        local_130 = (local_150 / 5.0 + 0.1 + local_160 / 5.0 + local_170 / 5.0) * 1.0;
        dVar2 = local_130 * local_130;
        dVar3 = local_130 * local_130;
        local_130 = local_130 * local_130;
      }
      m_target[4] = 1.0 / local_130;
      m_target[2] = 1.0 / dVar3;
      radius = 1.0 / dVar2;
      m_target[3] = 0.0;
      m_target[1] = 0.0;
      m_target[0] = 0.0;
      uVar1 = ref_matrix_intersect(&radius,m_int + 5,m_target + 5);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x1cd,"ref_metric_delta_box_node",(ulong)uVar1,"intersect");
        return uVar1;
      }
      uVar1 = ref_node_metric_set(ref_node_00,m[5]._4_4_,m_target + 5);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x1ce,"ref_metric_delta_box_node",(ulong)uVar1,"set node met");
        return uVar1;
      }
    }
    m[5]._4_4_ = m[5]._4_4_ + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_delta_box_node(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  REF_DBL m[6], m_int[6], m_target[6];
  REF_DBL radius, h;
  REF_DBL factor = 1.0;
  REF_DBL n[3], dot;

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_node_metric_get(ref_node, node, m), "get");
    n[0] = 0.90631;
    n[1] = 0.42262;
    n[2] = 0.0;
    dot = ref_math_dot(n, ref_node_xyz_ptr(ref_node, node));
    radius = sqrt(pow(ref_node_xyz(ref_node, 0, node) - dot * n[0], 2) +
                  pow(ref_node_xyz(ref_node, 1, node) - dot * n[1], 2) +
                  pow(ref_node_xyz(ref_node, 2, node) - dot * n[2], 2));
    h = MIN(0.0003 + 0.002 * radius / (0.15 * 0.42262), 0.007);
    h *= factor;
    m_target[0] = 1.0 / (h * h);
    m_target[1] = 0;
    m_target[2] = 0;
    m_target[3] = 1.0 / (h * h);
    m_target[4] = 0;
    m_target[5] = 1.0 / (h * h);
    if (ref_node_xyz(ref_node, 0, node) > 1.1) {
      REF_DBL ht, s, hx;
      ht = 0.007;
      s = (ref_node_xyz(ref_node, 0, node) - 1.1) / 3.9;
      s = MIN(1.0, MAX(0.0, s));
      hx = ht * (1.0 - s) + 10 * ht * s;
      hx *= factor;
      ht *= factor;
      m_target[0] = 1.0 / (hx * hx);
      m_target[1] = 0;
      m_target[2] = 0;
      m_target[3] = 1.0 / (ht * ht);
      m_target[4] = 0;
      m_target[5] = 1.0 / (ht * ht);
    }
    if (0.1 < ref_node_xyz(ref_node, 2, node) ||
        -0.1 > ref_node_xyz(ref_node, 2, node) ||
        1.0 < ref_node_xyz(ref_node, 1, node) ||
        -0.1 > ref_node_xyz(ref_node, 0, node)) {
      h = 0.1 + ABS(ref_node_xyz(ref_node, 2, node)) / 5.0 +
          ABS(ref_node_xyz(ref_node, 1, node)) / 5.0 +
          ABS(ref_node_xyz(ref_node, 0, node)) / 5.0;
      h *= factor;
      m_target[0] = 1.0 / (h * h);
      m_target[1] = 0;
      m_target[2] = 0;
      m_target[3] = 1.0 / (h * h);
      m_target[4] = 0;
      m_target[5] = 1.0 / (h * h);
    }
    RSS(ref_matrix_intersect(m_target, m, m_int), "intersect");
    RSS(ref_node_metric_set(ref_node, node, m_int), "set node met");
  }

  return REF_SUCCESS;
}